

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

void Scope::RemoveParamScope(ParseNodeFnc *pnodeScope)

{
  Scope *this;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Scope *pSVar4;
  Scope *bodyScope;
  Scope *paramScope;
  ParseNodeFnc *pnodeScope_local;
  
  if (pnodeScope->funcInfo == (FuncInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/Scope.cpp"
                       ,0x78,"(pnodeScope->funcInfo)","pnodeScope->funcInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pSVar4 = pnodeScope->pnodeScopes->scope;
  this = pnodeScope->pnodeBodyScope->scope;
  SetMustInstantiate(pSVar4,false);
  pSVar4->m_count = 0;
  pSVar4->scopeSlotCount = 0;
  pSVar4->m_symList = (Symbol *)0x0;
  pSVar4 = GetEnclosingScope(pSVar4);
  SetEnclosingScope(this,pSVar4);
  return;
}

Assistant:

void Scope::RemoveParamScope(ParseNodeFnc *pnodeScope)
{
    Assert(pnodeScope->funcInfo);
    Scope *paramScope = pnodeScope->pnodeScopes->scope;
    Scope *bodyScope = pnodeScope->pnodeBodyScope->scope;

    // Once the scopes are merged, there's no reason to instantiate the param scope.
    paramScope->SetMustInstantiate(false);

    paramScope->m_count = 0;
    paramScope->scopeSlotCount = 0;
    paramScope->m_symList = nullptr;
    // Remove the parameter scope from the scope chain.

    bodyScope->SetEnclosingScope(paramScope->GetEnclosingScope());
}